

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

UpdateWitnessStackTxInRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::ConvertToStruct
          (UpdateWitnessStackTxInRequestStruct *__return_storage_ptr__,
          UpdateWitnessStackTxInRequest *this)

{
  WitnessStackDataStruct local_d8;
  undefined1 local_19;
  UpdateWitnessStackTxInRequest *local_18;
  UpdateWitnessStackTxInRequest *this_local;
  UpdateWitnessStackTxInRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (UpdateWitnessStackTxInRequest *)__return_storage_ptr__;
  UpdateWitnessStackTxInRequestStruct::UpdateWitnessStackTxInRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->txid_);
  __return_storage_ptr__->vout = this->vout_;
  WitnessStackData::ConvertToStruct(&local_d8,&this->witness_stack_);
  WitnessStackDataStruct::operator=(&__return_storage_ptr__->witness_stack,&local_d8);
  WitnessStackDataStruct::~WitnessStackDataStruct(&local_d8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackTxInRequestStruct UpdateWitnessStackTxInRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackTxInRequestStruct result;
  result.txid = txid_;
  result.vout = vout_;
  result.witness_stack = witness_stack_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}